

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.h
# Opt level: O0

void fe_mul(int32_t *h,int32_t *f,int32_t *g)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int64_t h3;
  int64_t h2;
  int64_t h1;
  int64_t h0;
  int64_t f9g9_38;
  int64_t f9g8_19;
  int64_t f9g7_38;
  int64_t f9g6_19;
  int64_t f9g5_38;
  int64_t f9g4_19;
  int64_t f9g3_38;
  int64_t f9g2_19;
  int64_t f9g1_38;
  int64_t f9g0;
  int64_t f8g9_19;
  int64_t f8g8_19;
  int64_t f8g7_19;
  int64_t f8g6_19;
  int64_t f8g5_19;
  int64_t f8g4_19;
  int64_t f8g3_19;
  int64_t f8g2_19;
  int64_t f8g1;
  int64_t f8g0;
  int64_t f7g9_38;
  int64_t f7g8_19;
  int64_t f7g7_38;
  int64_t f7g6_19;
  int64_t f7g5_38;
  int64_t f7g4_19;
  int64_t f7g3_38;
  int64_t f7g2;
  int64_t f7g1_2;
  int64_t f7g0;
  int64_t f6g9_19;
  int64_t f6g8_19;
  int64_t f6g7_19;
  int64_t f6g6_19;
  int64_t f6g5_19;
  int64_t f6g4_19;
  int64_t f6g3;
  int64_t f6g2;
  int64_t f6g1;
  int64_t f6g0;
  int64_t f5g9_38;
  int64_t f5g8_19;
  int64_t f5g7_38;
  int64_t f5g6_19;
  int64_t f5g5_38;
  int64_t f5g4;
  int64_t f5g3_2;
  int64_t f5g2;
  int64_t f5g1_2;
  int64_t f5g0;
  int64_t f4g9_19;
  int64_t f4g8_19;
  int64_t f4g7_19;
  int64_t f4g6_19;
  int64_t f4g5;
  int64_t f4g4;
  int64_t f4g3;
  int64_t f4g2;
  int64_t f4g1;
  int64_t f4g0;
  int64_t f3g9_38;
  int64_t f3g8_19;
  int64_t f3g7_38;
  int64_t f3g6;
  int64_t f3g5_2;
  int64_t f3g4;
  int64_t f3g3_2;
  int64_t f3g2;
  int64_t f3g1_2;
  int64_t f3g0;
  int64_t f2g9_19;
  int64_t f2g8_19;
  int64_t f2g7;
  int64_t f2g6;
  int64_t f2g5;
  int64_t f2g4;
  int64_t f2g3;
  int64_t f2g2;
  int64_t f2g1;
  int64_t f2g0;
  int64_t f1g9_38;
  int64_t f1g8;
  int64_t f1g7_2;
  int64_t f1g6;
  int64_t f1g5_2;
  int64_t f1g4;
  int64_t f1g3_2;
  int64_t f1g2;
  int64_t f1g1_2;
  int64_t f1g0;
  int64_t f0g9;
  int64_t f0g8;
  int64_t f0g7;
  int64_t f0g6;
  int64_t f0g5;
  int64_t f0g4;
  int64_t f0g3;
  int64_t f0g2;
  int64_t f0g1;
  int64_t f0g0;
  int32_t f9_2;
  int32_t f7_2;
  int32_t f5_2;
  int32_t f3_2;
  int32_t f1_2;
  int32_t g9_19;
  int32_t g8_19;
  int32_t g7_19;
  int32_t g6_19;
  int32_t g5_19;
  int32_t g4_19;
  int32_t g3_19;
  int32_t g2_19;
  int32_t g1_19;
  int32_t g9;
  int32_t g8;
  int32_t g7;
  int32_t g6;
  int32_t g5;
  int32_t g4;
  int32_t g3;
  int32_t g2;
  int32_t g1;
  int32_t g0;
  int32_t f9;
  int32_t f8;
  int32_t f7;
  int32_t f6;
  int32_t f5;
  int32_t f4;
  int32_t f3;
  int32_t f2;
  int32_t f1;
  int32_t f0;
  int64_t carry9;
  int64_t carry8;
  int64_t carry7;
  int64_t carry6;
  int64_t carry5;
  int64_t carry4;
  int64_t carry3;
  int64_t carry2;
  int64_t carry1;
  int64_t carry0;
  int64_t h9;
  int64_t h8;
  int64_t h7;
  int64_t h6;
  int64_t h5;
  int64_t h4;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  iVar3 = in_RSI[2];
  iVar4 = in_RSI[3];
  iVar5 = in_RSI[4];
  iVar6 = in_RSI[5];
  iVar7 = in_RSI[6];
  iVar8 = in_RSI[7];
  iVar9 = in_RSI[8];
  iVar10 = in_RSI[9];
  iVar11 = *in_RDX;
  iVar12 = in_RDX[1];
  iVar13 = in_RDX[2];
  iVar14 = in_RDX[3];
  iVar15 = in_RDX[4];
  iVar16 = in_RDX[5];
  iVar17 = in_RDX[6];
  iVar18 = in_RDX[7];
  iVar19 = in_RDX[8];
  iVar20 = iVar14 * 0x13;
  iVar21 = iVar15 * 0x13;
  iVar22 = iVar16 * 0x13;
  iVar23 = iVar17 * 0x13;
  iVar24 = iVar18 * 0x13;
  iVar25 = iVar19 * 0x13;
  iVar26 = in_RDX[9] * 0x13;
  iVar27 = iVar2 << 1;
  iVar28 = iVar4 << 1;
  iVar29 = iVar6 << 1;
  iVar30 = iVar8 << 1;
  iVar31 = iVar10 << 1;
  lVar32 = (long)iVar1 * (long)iVar11 + (long)iVar27 * (long)iVar26 + (long)iVar3 * (long)iVar25 +
           (long)iVar28 * (long)iVar24 + (long)iVar5 * (long)iVar23 + (long)iVar29 * (long)iVar22 +
           (long)iVar7 * (long)iVar21 + (long)iVar30 * (long)iVar20 +
           (long)iVar9 * (long)(iVar13 * 0x13) + (long)iVar31 * (long)(iVar12 * 0x13);
  lVar33 = (long)iVar1 * (long)iVar15 + (long)iVar27 * (long)iVar14 + (long)iVar3 * (long)iVar13 +
           (long)iVar28 * (long)iVar12 + (long)iVar5 * (long)iVar11 + (long)iVar29 * (long)iVar26 +
           (long)iVar7 * (long)iVar25 + (long)iVar30 * (long)iVar24 + (long)iVar9 * (long)iVar23 +
           (long)iVar31 * (long)iVar22;
  uVar34 = lVar32 + 0x2000000;
  lVar35 = ((long)uVar34 >> 0x1a) +
           (long)iVar1 * (long)iVar12 + (long)iVar2 * (long)iVar11 + (long)iVar3 * (long)iVar26 +
           (long)iVar4 * (long)iVar25 + (long)iVar5 * (long)iVar24 + (long)iVar6 * (long)iVar23 +
           (long)iVar7 * (long)iVar22 + (long)iVar8 * (long)iVar21 + (long)iVar9 * (long)iVar20 +
           (long)iVar10 * (long)(iVar13 * 0x13);
  uVar36 = lVar33 + 0x2000000;
  lVar37 = ((long)uVar36 >> 0x1a) +
           (long)iVar1 * (long)iVar16 + (long)iVar2 * (long)iVar15 + (long)iVar3 * (long)iVar14 +
           (long)iVar4 * (long)iVar13 + (long)iVar5 * (long)iVar12 + (long)iVar6 * (long)iVar11 +
           (long)iVar7 * (long)iVar26 + (long)iVar8 * (long)iVar25 + (long)iVar9 * (long)iVar24 +
           (long)iVar10 * (long)iVar23;
  lVar38 = lVar35 + 0x1000000;
  lVar39 = (lVar38 >> 0x19) +
           (long)iVar1 * (long)iVar13 + (long)iVar27 * (long)iVar12 + (long)iVar3 * (long)iVar11 +
           (long)iVar28 * (long)iVar26 + (long)iVar5 * (long)iVar25 + (long)iVar29 * (long)iVar24 +
           (long)iVar7 * (long)iVar23 + (long)iVar30 * (long)iVar22 + (long)iVar9 * (long)iVar21 +
           (long)iVar31 * (long)iVar20;
  lVar40 = lVar37 + 0x1000000;
  lVar41 = (lVar40 >> 0x19) +
           (long)iVar1 * (long)iVar17 + (long)iVar27 * (long)iVar16 + (long)iVar3 * (long)iVar15 +
           (long)iVar28 * (long)iVar14 + (long)iVar5 * (long)iVar13 + (long)iVar29 * (long)iVar12 +
           (long)iVar7 * (long)iVar11 + (long)iVar30 * (long)iVar26 + (long)iVar9 * (long)iVar25 +
           (long)iVar31 * (long)iVar24;
  lVar42 = lVar39 + 0x2000000;
  lVar43 = (lVar42 >> 0x1a) +
           (long)iVar1 * (long)iVar14 + (long)iVar2 * (long)iVar13 + (long)iVar3 * (long)iVar12 +
           (long)iVar4 * (long)iVar11 + (long)iVar5 * (long)iVar26 + (long)iVar6 * (long)iVar25 +
           (long)iVar7 * (long)iVar24 + (long)iVar8 * (long)iVar23 + (long)iVar9 * (long)iVar22 +
           (long)iVar10 * (long)iVar21;
  lVar44 = lVar41 + 0x2000000;
  lVar45 = (lVar44 >> 0x1a) +
           (long)iVar1 * (long)iVar18 + (long)iVar2 * (long)iVar17 + (long)iVar3 * (long)iVar16 +
           (long)iVar4 * (long)iVar15 + (long)iVar5 * (long)iVar14 + (long)iVar6 * (long)iVar13 +
           (long)iVar7 * (long)iVar12 + (long)iVar8 * (long)iVar11 + (long)iVar9 * (long)iVar26 +
           (long)iVar10 * (long)iVar25;
  lVar46 = lVar43 + 0x1000000;
  lVar33 = (lVar46 >> 0x19) + (lVar33 - (uVar36 & 0xfffffffffc000000));
  lVar47 = lVar45 + 0x1000000;
  lVar48 = (lVar47 >> 0x19) +
           (long)iVar1 * (long)iVar19 + (long)iVar27 * (long)iVar18 + (long)iVar3 * (long)iVar17 +
           (long)iVar28 * (long)iVar16 + (long)iVar5 * (long)iVar15 + (long)iVar29 * (long)iVar14 +
           (long)iVar7 * (long)iVar13 + (long)iVar30 * (long)iVar12 + (long)iVar9 * (long)iVar11 +
           (long)iVar31 * (long)iVar26;
  lVar49 = lVar33 + 0x2000000;
  lVar50 = lVar48 + 0x2000000;
  lVar51 = (lVar50 >> 0x1a) +
           (long)iVar1 * (long)in_RDX[9] + (long)iVar2 * (long)iVar19 + (long)iVar3 * (long)iVar18 +
           (long)iVar4 * (long)iVar17 + (long)iVar5 * (long)iVar16 + (long)iVar6 * (long)iVar15 +
           (long)iVar7 * (long)iVar14 + (long)iVar8 * (long)iVar13 + (long)iVar9 * (long)iVar12 +
           (long)iVar10 * (long)iVar11;
  lVar52 = lVar51 + 0x1000000;
  lVar32 = (lVar52 >> 0x19) * 0x13 + (lVar32 - (uVar34 & 0xfffffffffc000000));
  lVar53 = lVar32 + 0x2000000;
  *in_RDI = (int)lVar32 - ((uint)lVar53 & 0xfc000000);
  in_RDI[1] = (int)(lVar53 >> 0x1a) + ((int)lVar35 - ((uint)lVar38 & 0xfe000000));
  in_RDI[2] = (int)lVar39 - ((uint)lVar42 & 0xfc000000);
  in_RDI[3] = (int)lVar43 - ((uint)lVar46 & 0xfe000000);
  in_RDI[4] = (int)lVar33 - ((uint)lVar49 & 0xfc000000);
  in_RDI[5] = (int)(lVar49 >> 0x1a) + ((int)lVar37 - ((uint)lVar40 & 0xfe000000));
  in_RDI[6] = (int)lVar41 - ((uint)lVar44 & 0xfc000000);
  in_RDI[7] = (int)lVar45 - ((uint)lVar47 & 0xfe000000);
  in_RDI[8] = (int)lVar48 - ((uint)lVar50 & 0xfc000000);
  in_RDI[9] = (int)lVar51 - ((uint)lVar52 & 0xfe000000);
  return;
}

Assistant:

static void fe_mul(fe h, const fe f, const fe g)
{
    int32_t f0 = f[0];
    int32_t f1 = f[1];
    int32_t f2 = f[2];
    int32_t f3 = f[3];
    int32_t f4 = f[4];
    int32_t f5 = f[5];
    int32_t f6 = f[6];
    int32_t f7 = f[7];
    int32_t f8 = f[8];
    int32_t f9 = f[9];
    int32_t g0 = g[0];
    int32_t g1 = g[1];
    int32_t g2 = g[2];
    int32_t g3 = g[3];
    int32_t g4 = g[4];
    int32_t g5 = g[5];
    int32_t g6 = g[6];
    int32_t g7 = g[7];
    int32_t g8 = g[8];
    int32_t g9 = g[9];
    int32_t g1_19 = 19 * g1; /* 1.959375*2^29 */
    int32_t g2_19 = 19 * g2; /* 1.959375*2^30; still ok */
    int32_t g3_19 = 19 * g3;
    int32_t g4_19 = 19 * g4;
    int32_t g5_19 = 19 * g5;
    int32_t g6_19 = 19 * g6;
    int32_t g7_19 = 19 * g7;
    int32_t g8_19 = 19 * g8;
    int32_t g9_19 = 19 * g9;
    int32_t f1_2 = 2 * f1;
    int32_t f3_2 = 2 * f3;
    int32_t f5_2 = 2 * f5;
    int32_t f7_2 = 2 * f7;
    int32_t f9_2 = 2 * f9;
    int64_t f0g0    = f0   * (int64_t) g0;
    int64_t f0g1    = f0   * (int64_t) g1;
    int64_t f0g2    = f0   * (int64_t) g2;
    int64_t f0g3    = f0   * (int64_t) g3;
    int64_t f0g4    = f0   * (int64_t) g4;
    int64_t f0g5    = f0   * (int64_t) g5;
    int64_t f0g6    = f0   * (int64_t) g6;
    int64_t f0g7    = f0   * (int64_t) g7;
    int64_t f0g8    = f0   * (int64_t) g8;
    int64_t f0g9    = f0   * (int64_t) g9;
    int64_t f1g0    = f1   * (int64_t) g0;
    int64_t f1g1_2  = f1_2 * (int64_t) g1;
    int64_t f1g2    = f1   * (int64_t) g2;
    int64_t f1g3_2  = f1_2 * (int64_t) g3;
    int64_t f1g4    = f1   * (int64_t) g4;
    int64_t f1g5_2  = f1_2 * (int64_t) g5;
    int64_t f1g6    = f1   * (int64_t) g6;
    int64_t f1g7_2  = f1_2 * (int64_t) g7;
    int64_t f1g8    = f1   * (int64_t) g8;
    int64_t f1g9_38 = f1_2 * (int64_t) g9_19;
    int64_t f2g0    = f2   * (int64_t) g0;
    int64_t f2g1    = f2   * (int64_t) g1;
    int64_t f2g2    = f2   * (int64_t) g2;
    int64_t f2g3    = f2   * (int64_t) g3;
    int64_t f2g4    = f2   * (int64_t) g4;
    int64_t f2g5    = f2   * (int64_t) g5;
    int64_t f2g6    = f2   * (int64_t) g6;
    int64_t f2g7    = f2   * (int64_t) g7;
    int64_t f2g8_19 = f2   * (int64_t) g8_19;
    int64_t f2g9_19 = f2   * (int64_t) g9_19;
    int64_t f3g0    = f3   * (int64_t) g0;
    int64_t f3g1_2  = f3_2 * (int64_t) g1;
    int64_t f3g2    = f3   * (int64_t) g2;
    int64_t f3g3_2  = f3_2 * (int64_t) g3;
    int64_t f3g4    = f3   * (int64_t) g4;
    int64_t f3g5_2  = f3_2 * (int64_t) g5;
    int64_t f3g6    = f3   * (int64_t) g6;
    int64_t f3g7_38 = f3_2 * (int64_t) g7_19;
    int64_t f3g8_19 = f3   * (int64_t) g8_19;
    int64_t f3g9_38 = f3_2 * (int64_t) g9_19;
    int64_t f4g0    = f4   * (int64_t) g0;
    int64_t f4g1    = f4   * (int64_t) g1;
    int64_t f4g2    = f4   * (int64_t) g2;
    int64_t f4g3    = f4   * (int64_t) g3;
    int64_t f4g4    = f4   * (int64_t) g4;
    int64_t f4g5    = f4   * (int64_t) g5;
    int64_t f4g6_19 = f4   * (int64_t) g6_19;
    int64_t f4g7_19 = f4   * (int64_t) g7_19;
    int64_t f4g8_19 = f4   * (int64_t) g8_19;
    int64_t f4g9_19 = f4   * (int64_t) g9_19;
    int64_t f5g0    = f5   * (int64_t) g0;
    int64_t f5g1_2  = f5_2 * (int64_t) g1;
    int64_t f5g2    = f5   * (int64_t) g2;
    int64_t f5g3_2  = f5_2 * (int64_t) g3;
    int64_t f5g4    = f5   * (int64_t) g4;
    int64_t f5g5_38 = f5_2 * (int64_t) g5_19;
    int64_t f5g6_19 = f5   * (int64_t) g6_19;
    int64_t f5g7_38 = f5_2 * (int64_t) g7_19;
    int64_t f5g8_19 = f5   * (int64_t) g8_19;
    int64_t f5g9_38 = f5_2 * (int64_t) g9_19;
    int64_t f6g0    = f6   * (int64_t) g0;
    int64_t f6g1    = f6   * (int64_t) g1;
    int64_t f6g2    = f6   * (int64_t) g2;
    int64_t f6g3    = f6   * (int64_t) g3;
    int64_t f6g4_19 = f6   * (int64_t) g4_19;
    int64_t f6g5_19 = f6   * (int64_t) g5_19;
    int64_t f6g6_19 = f6   * (int64_t) g6_19;
    int64_t f6g7_19 = f6   * (int64_t) g7_19;
    int64_t f6g8_19 = f6   * (int64_t) g8_19;
    int64_t f6g9_19 = f6   * (int64_t) g9_19;
    int64_t f7g0    = f7   * (int64_t) g0;
    int64_t f7g1_2  = f7_2 * (int64_t) g1;
    int64_t f7g2    = f7   * (int64_t) g2;
    int64_t f7g3_38 = f7_2 * (int64_t) g3_19;
    int64_t f7g4_19 = f7   * (int64_t) g4_19;
    int64_t f7g5_38 = f7_2 * (int64_t) g5_19;
    int64_t f7g6_19 = f7   * (int64_t) g6_19;
    int64_t f7g7_38 = f7_2 * (int64_t) g7_19;
    int64_t f7g8_19 = f7   * (int64_t) g8_19;
    int64_t f7g9_38 = f7_2 * (int64_t) g9_19;
    int64_t f8g0    = f8   * (int64_t) g0;
    int64_t f8g1    = f8   * (int64_t) g1;
    int64_t f8g2_19 = f8   * (int64_t) g2_19;
    int64_t f8g3_19 = f8   * (int64_t) g3_19;
    int64_t f8g4_19 = f8   * (int64_t) g4_19;
    int64_t f8g5_19 = f8   * (int64_t) g5_19;
    int64_t f8g6_19 = f8   * (int64_t) g6_19;
    int64_t f8g7_19 = f8   * (int64_t) g7_19;
    int64_t f8g8_19 = f8   * (int64_t) g8_19;
    int64_t f8g9_19 = f8   * (int64_t) g9_19;
    int64_t f9g0    = f9   * (int64_t) g0;
    int64_t f9g1_38 = f9_2 * (int64_t) g1_19;
    int64_t f9g2_19 = f9   * (int64_t) g2_19;
    int64_t f9g3_38 = f9_2 * (int64_t) g3_19;
    int64_t f9g4_19 = f9   * (int64_t) g4_19;
    int64_t f9g5_38 = f9_2 * (int64_t) g5_19;
    int64_t f9g6_19 = f9   * (int64_t) g6_19;
    int64_t f9g7_38 = f9_2 * (int64_t) g7_19;
    int64_t f9g8_19 = f9   * (int64_t) g8_19;
    int64_t f9g9_38 = f9_2 * (int64_t) g9_19;
    int64_t h0 = f0g0 + f1g9_38 + f2g8_19 + f3g7_38 + f4g6_19 + f5g5_38 + f6g4_19 + f7g3_38 + f8g2_19 + f9g1_38;
    int64_t h1 = f0g1 + f1g0    + f2g9_19 + f3g8_19 + f4g7_19 + f5g6_19 + f6g5_19 + f7g4_19 + f8g3_19 + f9g2_19;
    int64_t h2 = f0g2 + f1g1_2  + f2g0    + f3g9_38 + f4g8_19 + f5g7_38 + f6g6_19 + f7g5_38 + f8g4_19 + f9g3_38;
    int64_t h3 = f0g3 + f1g2    + f2g1    + f3g0    + f4g9_19 + f5g8_19 + f6g7_19 + f7g6_19 + f8g5_19 + f9g4_19;
    int64_t h4 = f0g4 + f1g3_2  + f2g2    + f3g1_2  + f4g0    + f5g9_38 + f6g8_19 + f7g7_38 + f8g6_19 + f9g5_38;
    int64_t h5 = f0g5 + f1g4    + f2g3    + f3g2    + f4g1    + f5g0    + f6g9_19 + f7g8_19 + f8g7_19 + f9g6_19;
    int64_t h6 = f0g6 + f1g5_2  + f2g4    + f3g3_2  + f4g2    + f5g1_2  + f6g0    + f7g9_38 + f8g8_19 + f9g7_38;
    int64_t h7 = f0g7 + f1g6    + f2g5    + f3g4    + f4g3    + f5g2    + f6g1    + f7g0    + f8g9_19 + f9g8_19;
    int64_t h8 = f0g8 + f1g7_2  + f2g6    + f3g5_2  + f4g4    + f5g3_2  + f6g2    + f7g1_2  + f8g0    + f9g9_38;
    int64_t h9 = f0g9 + f1g8    + f2g7    + f3g6    + f4g5    + f5g4    + f6g3    + f7g2    + f8g1    + f9g0   ;
    int64_t carry0;
    int64_t carry1;
    int64_t carry2;
    int64_t carry3;
    int64_t carry4;
    int64_t carry5;
    int64_t carry6;
    int64_t carry7;
    int64_t carry8;
    int64_t carry9;

    /* |h0| <= (1.65*1.65*2^52*(1+19+19+19+19)+1.65*1.65*2^50*(38+38+38+38+38))
     *   i.e. |h0| <= 1.4*2^60; narrower ranges for h2, h4, h6, h8
     * |h1| <= (1.65*1.65*2^51*(1+1+19+19+19+19+19+19+19+19))
     *   i.e. |h1| <= 1.7*2^59; narrower ranges for h3, h5, h7, h9 */

    carry0 = h0 + (1 << 25); h1 += carry0 >> 26; h0 -= carry0 & kTop38Bits;
    carry4 = h4 + (1 << 25); h5 += carry4 >> 26; h4 -= carry4 & kTop38Bits;
    /* |h0| <= 2^25 */
    /* |h4| <= 2^25 */
    /* |h1| <= 1.71*2^59 */
    /* |h5| <= 1.71*2^59 */

    carry1 = h1 + (1 << 24); h2 += carry1 >> 25; h1 -= carry1 & kTop39Bits;
    carry5 = h5 + (1 << 24); h6 += carry5 >> 25; h5 -= carry5 & kTop39Bits;
    /* |h1| <= 2^24; from now on fits into int32 */
    /* |h5| <= 2^24; from now on fits into int32 */
    /* |h2| <= 1.41*2^60 */
    /* |h6| <= 1.41*2^60 */

    carry2 = h2 + (1 << 25); h3 += carry2 >> 26; h2 -= carry2 & kTop38Bits;
    carry6 = h6 + (1 << 25); h7 += carry6 >> 26; h6 -= carry6 & kTop38Bits;
    /* |h2| <= 2^25; from now on fits into int32 unchanged */
    /* |h6| <= 2^25; from now on fits into int32 unchanged */
    /* |h3| <= 1.71*2^59 */
    /* |h7| <= 1.71*2^59 */

    carry3 = h3 + (1 << 24); h4 += carry3 >> 25; h3 -= carry3 & kTop39Bits;
    carry7 = h7 + (1 << 24); h8 += carry7 >> 25; h7 -= carry7 & kTop39Bits;
    /* |h3| <= 2^24; from now on fits into int32 unchanged */
    /* |h7| <= 2^24; from now on fits into int32 unchanged */
    /* |h4| <= 1.72*2^34 */
    /* |h8| <= 1.41*2^60 */

    carry4 = h4 + (1 << 25); h5 += carry4 >> 26; h4 -= carry4 & kTop38Bits;
    carry8 = h8 + (1 << 25); h9 += carry8 >> 26; h8 -= carry8 & kTop38Bits;
    /* |h4| <= 2^25; from now on fits into int32 unchanged */
    /* |h8| <= 2^25; from now on fits into int32 unchanged */
    /* |h5| <= 1.01*2^24 */
    /* |h9| <= 1.71*2^59 */

    carry9 = h9 + (1 << 24); h0 += (carry9 >> 25) * 19; h9 -= carry9 & kTop39Bits;
    /* |h9| <= 2^24; from now on fits into int32 unchanged */
    /* |h0| <= 1.1*2^39 */

    carry0 = h0 + (1 << 25); h1 += carry0 >> 26; h0 -= carry0 & kTop38Bits;
    /* |h0| <= 2^25; from now on fits into int32 unchanged */
    /* |h1| <= 1.01*2^24 */

    h[0] = (int32_t)h0;
    h[1] = (int32_t)h1;
    h[2] = (int32_t)h2;
    h[3] = (int32_t)h3;
    h[4] = (int32_t)h4;
    h[5] = (int32_t)h5;
    h[6] = (int32_t)h6;
    h[7] = (int32_t)h7;
    h[8] = (int32_t)h8;
    h[9] = (int32_t)h9;
}